

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *
parseV5EntryFormat(Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>
                   *__return_storage_ptr__,DWARFDataExtractor *DebugLineData,uint64_t *OffsetPtr,
                  uint64_t EndPrologueOffset,ContentTypeTracker *ContentTypes)

{
  byte bVar1;
  uint64_t uVar2;
  error_code EC;
  error_code EC_00;
  error_code local_c0;
  Error local_b0;
  ContentDescriptor local_a4;
  ContentDescriptor Descriptor;
  char *local_90;
  Error local_88;
  uint local_7c;
  byte local_75;
  int I;
  bool HasPath;
  uint local_64;
  undefined1 local_60 [4];
  int FormatCount;
  ContentDescriptors Descriptors;
  ContentTypeTracker *ContentTypes_local;
  uint64_t EndPrologueOffset_local;
  uint64_t *OffsetPtr_local;
  DWARFDataExtractor *DebugLineData_local;
  
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer = (char  [8])ContentTypes;
  llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>::SmallVector
            ((SmallVector<(anonymous_namespace)::ContentDescriptor,_4U> *)local_60);
  bVar1 = llvm::DataExtractor::getU8(&DebugLineData->super_DataExtractor,OffsetPtr,(Error *)0x0);
  local_64 = (uint)bVar1;
  local_75 = 0;
  local_7c = 0;
  do {
    if (local_7c == local_64) {
      if ((local_75 & 1) == 0) {
        std::error_code::error_code<llvm::errc,void>(&local_c0,invalid_argument);
        EC_00._M_cat._0_4_ = local_c0._M_value;
        EC_00._0_8_ = &local_b0;
        EC_00._M_cat._4_4_ = 0;
        llvm::createStringError(EC_00,(char *)local_c0._M_cat);
        llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::Expected
                  (__return_storage_ptr__,&local_b0);
        llvm::Error::~Error(&local_b0);
      }
      else {
        llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,4u>>::
        Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,4u>>
                  ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,4u>> *)
                   __return_storage_ptr__,
                   (SmallVector<(anonymous_namespace)::ContentDescriptor,_4U> *)local_60,(type *)0x0
                  );
      }
LAB_020196f7:
      Descriptor.Type = DW_LNCT_path;
      llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>::~SmallVector
                ((SmallVector<(anonymous_namespace)::ContentDescriptor,_4U> *)local_60);
      return __return_storage_ptr__;
    }
    if (EndPrologueOffset <= *OffsetPtr) {
      std::error_code::error_code<llvm::errc,void>((error_code *)&Descriptor.Form,invalid_argument);
      EC._M_cat._0_2_ = Descriptor.Form;
      EC._M_cat._2_2_ = Descriptor._6_2_;
      EC._0_8_ = &local_88;
      EC._M_cat._4_4_ = 0;
      llvm::createStringError<unsigned_long,unsigned_long>
                (EC,local_90,
                 (unsigned_long *)
                 "failed to parse entry content descriptions at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                 ,OffsetPtr);
      llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::Expected
                (__return_storage_ptr__,&local_88);
      llvm::Error::~Error(&local_88);
      goto LAB_020196f7;
    }
    uVar2 = llvm::DataExtractor::getULEB128
                      (&DebugLineData->super_DataExtractor,OffsetPtr,(Error *)0x0);
    local_a4.Type = (LineNumberEntryFormat)uVar2;
    uVar2 = llvm::DataExtractor::getULEB128
                      (&DebugLineData->super_DataExtractor,OffsetPtr,(Error *)0x0);
    local_a4.Form = (Form)uVar2;
    if (local_a4.Type == DW_LNCT_path) {
      local_75 = 1;
    }
    if (Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
        InlineElts[3].buffer != (char  [8])0x0) {
      llvm::DWARFDebugLine::ContentTypeTracker::trackContentType
                ((ContentTypeTracker *)
                 Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                 InlineElts[3].buffer,local_a4.Type);
    }
    llvm::SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>::push_back
              ((SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true> *)local_60,
               &local_a4);
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

static llvm::Expected<ContentDescriptors>
parseV5EntryFormat(const DWARFDataExtractor &DebugLineData, uint64_t *OffsetPtr,
                   uint64_t EndPrologueOffset,
                   DWARFDebugLine::ContentTypeTracker *ContentTypes) {
  ContentDescriptors Descriptors;
  int FormatCount = DebugLineData.getU8(OffsetPtr);
  bool HasPath = false;
  for (int I = 0; I != FormatCount; ++I) {
    if (*OffsetPtr >= EndPrologueOffset)
      return createStringError(
          errc::invalid_argument,
          "failed to parse entry content descriptions at offset "
          "0x%8.8" PRIx64
          " because offset extends beyond the prologue end at offset "
          "0x%8.8" PRIx64,
          *OffsetPtr, EndPrologueOffset);
    ContentDescriptor Descriptor;
    Descriptor.Type =
      dwarf::LineNumberEntryFormat(DebugLineData.getULEB128(OffsetPtr));
    Descriptor.Form = dwarf::Form(DebugLineData.getULEB128(OffsetPtr));
    if (Descriptor.Type == dwarf::DW_LNCT_path)
      HasPath = true;
    if (ContentTypes)
      ContentTypes->trackContentType(Descriptor.Type);
    Descriptors.push_back(Descriptor);
  }

  if (!HasPath)
    return createStringError(errc::invalid_argument,
                             "failed to parse entry content descriptions"
                             " because no path was found");
  return Descriptors;
}